

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cc
# Opt level: O0

void __thiscall
absl::lts_20240722::flags_internal::FlagRegistry::RegisterFlag
          (FlagRegistry *this,CommandLineFlag *flag,char *filename)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  pointer prVar4;
  long lVar5;
  long lVar6;
  char **in_stack_fffffffffffff680;
  char (*in_stack_fffffffffffff688) [179];
  bool local_8c1;
  undefined1 local_8c0 [80];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  AlphaNum local_850;
  AlphaNum local_820;
  string_view local_7f0;
  AlphaNum local_7e0;
  AlphaNum local_7b0;
  string local_780;
  undefined1 local_760 [16];
  undefined1 local_750 [80];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  AlphaNum local_6e0;
  AlphaNum local_6b0;
  string_view local_680;
  AlphaNum local_670;
  AlphaNum local_640;
  string local_610;
  undefined1 local_5f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  undefined4 local_59c;
  undefined1 local_598 [80];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  AlphaNum local_528;
  AlphaNum local_4f8;
  string_view local_4c8;
  AlphaNum local_4b8;
  AlphaNum local_488;
  string local_458;
  undefined1 local_438 [16];
  AlphaNum local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  AlphaNum local_3d8;
  AlphaNum local_3a8;
  string_view local_378;
  AlphaNum local_368;
  AlphaNum local_338;
  string local_308;
  undefined1 local_2e8 [16];
  CommandLineFlag *local_2d8;
  CommandLineFlag *old_flag;
  basic_string_view<char,_std::char_traits<char>_> local_2c8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>
  local_2b8;
  undefined1 local_2a0 [8];
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>::iterator,_bool>
  ins;
  FlagRegistryLock registry_lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  AlphaNum local_230;
  AlphaNum local_200;
  string_view local_1d0;
  AlphaNum local_1c0;
  AlphaNum local_190;
  string local_160;
  undefined1 local_140 [16];
  byte local_129;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  byte local_115;
  FlagsUsageConfig local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  byte local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_20 [8];
  char *filename_local;
  CommandLineFlag *flag_local;
  FlagRegistry *this_local;
  
  local_41 = 0;
  local_115 = 0;
  local_129 = 0;
  local_8c1 = false;
  local_20 = (undefined1  [8])filename;
  filename_local = (char *)flag;
  flag_local = (CommandLineFlag *)this;
  if (filename != (char *)0x0) {
    (**(code **)(*(long *)flag + 8))(&local_40);
    local_41 = 1;
    absl::lts_20240722::flags_internal::GetUsageConfig();
    local_115 = 1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_128,(char *)local_20);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()(&local_68,&local_108.normalize_filename,local_128);
    local_129 = 1;
    local_8c1 = std::operator!=(&local_40,&local_68);
  }
  if ((local_129 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_68);
  }
  if ((local_115 & 1) != 0) {
    FlagsUsageConfig::~FlagsUsageConfig(&local_108);
  }
  if ((local_41 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (local_8c1 != false) {
    AlphaNum::AlphaNum(&local_190,"Inconsistency between flag object and registration for flag \'");
    local_1d0 = (string_view)(*(code *)**(undefined8 **)filename_local)();
    AlphaNum::AlphaNum(&local_1c0,local_1d0);
    AlphaNum::AlphaNum(&local_200,
                       "\', likely due to duplicate flags or an ODR violation. Relevant files: ");
    (**(code **)(*(long *)filename_local + 8))();
    AlphaNum::AlphaNum<std::allocator<char>>(&local_230,&local_250);
    AlphaNum::AlphaNum((AlphaNum *)&registry_lock," and ");
    StrCat<char_const*>(&local_160,(lts_20240722 *)&local_190,&local_1c0,&local_200,&local_230,
                        (AlphaNum *)&registry_lock,(AlphaNum *)local_20,in_stack_fffffffffffff680);
    local_140 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_160);
    absl::lts_20240722::flags_internal::ReportUsageError(local_140._0_8_,local_140._8_8_,1);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_250);
    exit(1);
  }
  anon_unknown_6::FlagRegistryLock::FlagRegistryLock((FlagRegistryLock *)&ins.second,this);
  local_2c8 = (basic_string_view<char,_std::char_traits<char>_>)
              (*(code *)**(undefined8 **)filename_local)();
  old_flag = (CommandLineFlag *)filename_local;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>
  ::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*,_true>
            (&local_2b8,&local_2c8,&old_flag);
  container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
  ::
  insert<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_0,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_0,_nullptr>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>::iterator,_bool>
              *)local_2a0,
             (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
              *)this,&local_2b8);
  if ((ins.first.field_1._0_1_ & 1) != 0) {
    local_59c = 0;
LAB_00126e10:
    anon_unknown_6::FlagRegistryLock::~FlagRegistryLock((FlagRegistryLock *)&ins.second);
    return;
  }
  prVar4 = container_internal::
           raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
           ::iterator::operator->((iterator *)local_2a0);
  local_2d8 = prVar4->second;
  bVar1 = (**(code **)(*(long *)filename_local + 0x18))();
  bVar2 = (**(code **)(*(long *)local_2d8 + 0x18))();
  if ((bVar1 & 1) == (bVar2 & 1)) {
    lVar5 = absl::lts_20240722::flags_internal::PrivateHandleAccessor::TypeId
                      ((CommandLineFlag *)filename_local);
    lVar6 = absl::lts_20240722::flags_internal::PrivateHandleAccessor::TypeId(local_2d8);
    if (lVar5 == lVar6) {
      bVar1 = (**(code **)(*(long *)local_2d8 + 0x18))();
      if ((bVar1 & 1) != 0) {
        local_59c = 1;
        goto LAB_00126e10;
      }
      (**(code **)(*(long *)local_2d8 + 8))(&local_5c0);
      (**(code **)(*(long *)filename_local + 8))(&local_5e0);
      bVar3 = std::operator!=(&local_5c0,&local_5e0);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_5c0);
      if (bVar3) {
        AlphaNum::AlphaNum(&local_640,"Flag \'");
        local_680 = (string_view)(*(code *)**(undefined8 **)filename_local)();
        AlphaNum::AlphaNum(&local_670,local_680);
        AlphaNum::AlphaNum(&local_6b0,"\' was defined more than once (in files \'");
        (**(code **)(*(long *)local_2d8 + 8))(&local_700);
        AlphaNum::AlphaNum<std::allocator<char>>(&local_6e0,&local_700);
        AlphaNum::AlphaNum((AlphaNum *)(local_750 + 0x20),"\' and \'");
        (**(code **)(*(long *)filename_local + 8))(local_750);
        StrCat<std::__cxx11::string,char[4]>
                  (&local_610,(lts_20240722 *)&local_640,&local_670,&local_6b0,&local_6e0,
                   (AlphaNum *)(local_750 + 0x20),(AlphaNum *)local_750,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\').",
                   (char (*) [4])in_stack_fffffffffffff688);
        local_5f0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_610);
        absl::lts_20240722::flags_internal::ReportUsageError(local_5f0._0_8_,local_5f0._8_8_,1);
        std::__cxx11::string::~string((string *)&local_610);
        std::__cxx11::string::~string((string *)local_750);
        std::__cxx11::string::~string((string *)&local_700);
      }
      else {
        AlphaNum::AlphaNum(&local_7b0,"Something is wrong with flag \'");
        local_7f0 = (string_view)(*(code *)**(undefined8 **)filename_local)();
        AlphaNum::AlphaNum(&local_7e0,local_7f0);
        AlphaNum::AlphaNum(&local_820,"\' in file \'");
        (**(code **)(*(long *)filename_local + 8))(&local_870);
        AlphaNum::AlphaNum<std::allocator<char>>(&local_850,&local_870);
        AlphaNum::AlphaNum((AlphaNum *)(local_8c0 + 0x20),"\'. One possibility: file \'");
        (**(code **)(*(long *)filename_local + 8))(local_8c0);
        StrCat<std::__cxx11::string,char[179]>
                  (&local_780,(lts_20240722 *)&local_7b0,&local_7e0,&local_820,&local_850,
                   (AlphaNum *)(local_8c0 + 0x20),(AlphaNum *)local_8c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\' is being linked both statically and dynamically into this executable. e.g. some files listed as srcs to a test and also listed as srcs of some shared lib deps of the same test."
                   ,in_stack_fffffffffffff688);
        local_760 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_780);
        absl::lts_20240722::flags_internal::ReportUsageError(local_760._0_8_,local_760._8_8_,1);
        std::__cxx11::string::~string((string *)&local_780);
        std::__cxx11::string::~string((string *)local_8c0);
        std::__cxx11::string::~string((string *)&local_870);
      }
    }
    else {
      AlphaNum::AlphaNum(&local_488,"Flag \'");
      local_4c8 = (string_view)(*(code *)**(undefined8 **)filename_local)();
      AlphaNum::AlphaNum(&local_4b8,local_4c8);
      AlphaNum::AlphaNum(&local_4f8,
                         "\' was defined more than once but with differing types. Defined in files \'"
                        );
      (**(code **)(*(long *)local_2d8 + 8))(&local_548);
      AlphaNum::AlphaNum<std::allocator<char>>(&local_528,&local_548);
      AlphaNum::AlphaNum((AlphaNum *)(local_598 + 0x20),"\' and \'");
      (**(code **)(*(long *)filename_local + 8))(local_598);
      StrCat<std::__cxx11::string,char[3]>
                (&local_458,(lts_20240722 *)&local_488,&local_4b8,&local_4f8,&local_528,
                 (AlphaNum *)(local_598 + 0x20),(AlphaNum *)local_598,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\'.",
                 (char (*) [3])in_stack_fffffffffffff688);
      local_438 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_458);
      absl::lts_20240722::flags_internal::ReportUsageError(local_438._0_8_,local_438._8_8_,1);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)local_598);
      std::__cxx11::string::~string((string *)&local_548);
    }
  }
  else {
    AlphaNum::AlphaNum(&local_338,"Retired flag \'");
    local_378 = (string_view)(*(code *)**(undefined8 **)filename_local)();
    AlphaNum::AlphaNum(&local_368,local_378);
    AlphaNum::AlphaNum(&local_3a8,"\' was defined normally in file \'");
    bVar1 = (**(code **)(*(long *)filename_local + 0x18))();
    if ((bVar1 & 1) == 0) {
      (**(code **)(*(long *)filename_local + 8))(&local_3f8);
    }
    else {
      (**(code **)(*(long *)local_2d8 + 8))(&local_3f8);
    }
    AlphaNum::AlphaNum<std::allocator<char>>(&local_3d8,&local_3f8);
    AlphaNum::AlphaNum(&local_428,"\'.");
    StrCat<>(&local_308,&local_338,&local_368,&local_3a8,&local_3d8,&local_428);
    local_2e8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_308);
    absl::lts_20240722::flags_internal::ReportUsageError(local_2e8._0_8_,local_2e8._8_8_,1);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_3f8);
  }
  exit(1);
}

Assistant:

void FlagRegistry::RegisterFlag(CommandLineFlag& flag, const char* filename) {
  if (filename != nullptr &&
      flag.Filename() != GetUsageConfig().normalize_filename(filename)) {
    flags_internal::ReportUsageError(
        absl::StrCat(
            "Inconsistency between flag object and registration for flag '",
            flag.Name(),
            "', likely due to duplicate flags or an ODR violation. Relevant "
            "files: ",
            flag.Filename(), " and ", filename),
        true);
    std::exit(1);
  }

  FlagRegistryLock registry_lock(*this);

  std::pair<FlagIterator, bool> ins =
      flags_.insert(FlagMap::value_type(flag.Name(), &flag));
  if (ins.second == false) {  // means the name was already in the map
    CommandLineFlag& old_flag = *ins.first->second;
    if (flag.IsRetired() != old_flag.IsRetired()) {
      // All registrations must agree on the 'retired' flag.
      flags_internal::ReportUsageError(
          absl::StrCat(
              "Retired flag '", flag.Name(), "' was defined normally in file '",
              (flag.IsRetired() ? old_flag.Filename() : flag.Filename()), "'."),
          true);
    } else if (flags_internal::PrivateHandleAccessor::TypeId(flag) !=
               flags_internal::PrivateHandleAccessor::TypeId(old_flag)) {
      flags_internal::ReportUsageError(
          absl::StrCat("Flag '", flag.Name(),
                       "' was defined more than once but with "
                       "differing types. Defined in files '",
                       old_flag.Filename(), "' and '", flag.Filename(), "'."),
          true);
    } else if (old_flag.IsRetired()) {
      return;
    } else if (old_flag.Filename() != flag.Filename()) {
      flags_internal::ReportUsageError(
          absl::StrCat("Flag '", flag.Name(),
                       "' was defined more than once (in files '",
                       old_flag.Filename(), "' and '", flag.Filename(), "')."),
          true);
    } else {
      flags_internal::ReportUsageError(
          absl::StrCat(
              "Something is wrong with flag '", flag.Name(), "' in file '",
              flag.Filename(), "'. One possibility: file '", flag.Filename(),
              "' is being linked both statically and dynamically into this "
              "executable. e.g. some files listed as srcs to a test and also "
              "listed as srcs of some shared lib deps of the same test."),
          true);
    }
    // All cases above are fatal, except for the retired flags.
    std::exit(1);
  }
}